

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_clock.c
# Opt level: O1

nni_time nni_clock(void)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  undefined1 local_18 [8];
  timespec ts;
  
  iVar1 = clock_gettime(1,(timespec *)local_18);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    nni_panic("clock_gettime failed: %s",pcVar3);
  }
  return ts.tv_sec / 1000000 + (long)local_18 * 1000;
}

Assistant:

nni_time
nni_clock(void)
{
	struct timespec ts;
	nni_time        msec;

	if (clock_gettime(NNG_USE_CLOCKID, &ts) != 0) {
		// This should never ever occur.
		nni_panic("clock_gettime failed: %s", strerror(errno));
	}

	msec = ts.tv_sec;
	msec *= 1000;
	msec += (ts.tv_nsec / 1000000);
	return (msec);
}